

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O0

CURLcode Curl_ssl_scache_add_obj
                   (Curl_cfilter *cf,Curl_easy *data,char *ssl_peer_key,void *sobj,
                   Curl_ssl_scache_obj_dtor *sobj_free)

{
  CURLcode local_4c;
  Curl_ssl_scache_peer *pCStack_48;
  CURLcode result;
  Curl_ssl_scache_peer *peer;
  ssl_primary_config *conn_config;
  Curl_ssl_scache *scache;
  Curl_ssl_scache_obj_dtor *sobj_free_local;
  void *sobj_local;
  char *ssl_peer_key_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  scache = (Curl_ssl_scache *)sobj_free;
  sobj_free_local = (Curl_ssl_scache_obj_dtor *)sobj;
  sobj_local = ssl_peer_key;
  ssl_peer_key_local = (char *)data;
  data_local = (Curl_easy *)cf;
  conn_config = (ssl_primary_config *)cf_ssl_scache_get(data);
  peer = (Curl_ssl_scache_peer *)Curl_ssl_cf_get_primary_config((Curl_cfilter *)data_local);
  pCStack_48 = (Curl_ssl_scache_peer *)0x0;
  if (conn_config == (ssl_primary_config *)0x0) {
    local_4c = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    local_4c = cf_ssl_add_peer((Curl_easy *)ssl_peer_key_local,(Curl_ssl_scache *)conn_config,
                               (char *)sobj_local,(ssl_primary_config *)peer,
                               &stack0xffffffffffffffb8);
    if ((local_4c == CURLE_OK) && (pCStack_48 != (Curl_ssl_scache_peer *)0x0)) {
      cf_ssl_scache_peer_set_obj(pCStack_48,sobj_free_local,(Curl_ssl_scache_obj_dtor *)scache);
      sobj_free_local = (Curl_ssl_scache_obj_dtor *)0x0;
    }
    else if (((ssl_peer_key_local != (char *)0x0) &&
             ((*(ulong *)(ssl_peer_key_local + 0xa2c) >> 0x1e & 1) != 0)) &&
            (((*(long *)(ssl_peer_key_local + 0x1310) == 0 ||
              (0 < *(int *)(*(long *)(ssl_peer_key_local + 0x1310) + 8))) &&
             (0 < Curl_trc_feat_ssls.log_level)))) {
      Curl_trc_ssls((Curl_easy *)ssl_peer_key_local,"unable to add scache peer: %d",(ulong)local_4c)
      ;
    }
  }
  if ((sobj_free_local != (Curl_ssl_scache_obj_dtor *)0x0) && (scache != (Curl_ssl_scache *)0x0)) {
    (*(code *)scache)(sobj_free_local);
  }
  return local_4c;
}

Assistant:

CURLcode Curl_ssl_scache_add_obj(struct Curl_cfilter *cf,
                                 struct Curl_easy *data,
                                 const char *ssl_peer_key,
                                 void *sobj,
                                 Curl_ssl_scache_obj_dtor *sobj_free)
{
  struct Curl_ssl_scache *scache = cf_ssl_scache_get(data);
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  struct Curl_ssl_scache_peer *peer = NULL;
  CURLcode result;

  DEBUGASSERT(sobj);
  DEBUGASSERT(sobj_free);

  if(!scache) {
    result = CURLE_BAD_FUNCTION_ARGUMENT;
    goto out;
  }

  result = cf_ssl_add_peer(data, scache, ssl_peer_key, conn_config, &peer);
  if(result || !peer) {
    CURL_TRC_SSLS(data, "unable to add scache peer: %d", result);
    goto out;
  }

  cf_ssl_scache_peer_set_obj(peer, sobj, sobj_free);
  sobj = NULL;  /* peer took ownership */

out:
  if(sobj && sobj_free)
    sobj_free(sobj);
  return result;
}